

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::VersionSet::ReuseManifest(VersionSet *this,string *dscname,string *dscbase)

{
  Logger *pLVar1;
  bool bVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  size_t sVar6;
  undefined8 uVar7;
  Writer *this_00;
  Status local_88 [4];
  Status local_68;
  Status r;
  Status local_48;
  ulong local_40;
  uint64_t manifest_size;
  uint64_t manifest_number;
  string *psStack_28;
  FileType manifest_type;
  string *dscbase_local;
  string *dscname_local;
  VersionSet *this_local;
  
  if ((this->options_->reuse_logs & 1U) == 0) {
    this_local._7_1_ = 0;
  }
  else {
    psStack_28 = dscbase;
    dscbase_local = dscname;
    dscname_local = (string *)this;
    bVar4 = ParseFileName(dscbase,&manifest_size,(FileType *)((long)&manifest_number + 4));
    bVar2 = false;
    bVar5 = true;
    if ((bVar4) && (bVar5 = true, manifest_number._4_4_ == 3)) {
      (*this->env_->_vptr_Env[0xb])(&local_48,this->env_,dscbase_local,&local_40);
      bVar2 = true;
      bVar4 = Status::ok(&local_48);
      uVar3 = local_40;
      bVar5 = true;
      if (bVar4) {
        sVar6 = TargetFileSize(this->options_);
        bVar5 = sVar6 <= uVar3;
      }
    }
    if (bVar2) {
      Status::~Status(&local_48);
    }
    if (bVar5) {
      this_local._7_1_ = 0;
    }
    else {
      if (this->descriptor_file_ != (WritableFile *)0x0) {
        __assert_fail("descriptor_file_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                      ,0x402,
                      "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                     );
      }
      if (this->descriptor_log_ != (Writer *)0x0) {
        __assert_fail("descriptor_log_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                      ,0x403,
                      "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                     );
      }
      (*this->env_->_vptr_Env[5])(&local_68,this->env_,dscbase_local,&this->descriptor_file_);
      bVar5 = Status::ok(&local_68);
      if (bVar5) {
        pLVar1 = this->options_->info_log;
        uVar7 = std::__cxx11::string::c_str();
        Log(pLVar1,"Reusing MANIFEST %s\n",uVar7);
        this_00 = (Writer *)operator_new(0x20);
        log::Writer::Writer(this_00,this->descriptor_file_,local_40);
        this->descriptor_log_ = this_00;
        this->manifest_file_number_ = manifest_size;
        this_local._7_1_ = 1;
      }
      else {
        pLVar1 = this->options_->info_log;
        Status::ToString_abi_cxx11_(local_88);
        uVar7 = std::__cxx11::string::c_str();
        Log(pLVar1,"Reuse MANIFEST: %s\n",uVar7);
        std::__cxx11::string::~string((string *)local_88);
        if (this->descriptor_file_ != (WritableFile *)0x0) {
          __assert_fail("descriptor_file_ == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                        ,0x407,
                        "bool leveldb::VersionSet::ReuseManifest(const std::string &, const std::string &)"
                       );
        }
        this_local._7_1_ = 0;
      }
      Status::~Status(&local_68);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool VersionSet::ReuseManifest(const std::string& dscname,
                               const std::string& dscbase) {
  if (!options_->reuse_logs) {
    return false;
  }
  FileType manifest_type;
  uint64_t manifest_number;
  uint64_t manifest_size;
  if (!ParseFileName(dscbase, &manifest_number, &manifest_type) ||
      manifest_type != kDescriptorFile ||
      !env_->GetFileSize(dscname, &manifest_size).ok() ||
      // Make new compacted MANIFEST if old one is too big
      manifest_size >= TargetFileSize(options_)) {
    return false;
  }

  assert(descriptor_file_ == nullptr);
  assert(descriptor_log_ == nullptr);
  Status r = env_->NewAppendableFile(dscname, &descriptor_file_);
  if (!r.ok()) {
    Log(options_->info_log, "Reuse MANIFEST: %s\n", r.ToString().c_str());
    assert(descriptor_file_ == nullptr);
    return false;
  }

  Log(options_->info_log, "Reusing MANIFEST %s\n", dscname.c_str());
  descriptor_log_ = new log::Writer(descriptor_file_, manifest_size);
  manifest_file_number_ = manifest_number;
  return true;
}